

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O1

void __thiscall QStringMatcher::QStringMatcher(QStringMatcher *this,QStringMatcher *other)

{
  storage_type_conflict *psVar1;
  
  this->d_ptr = (QStringMatcherPrivate *)0x0;
  this->q_cs = CaseSensitive;
  memset(&this->q_pattern,0,0x128);
  if (this != other) {
    QArrayDataPointer<char16_t>::operator=(&(this->q_pattern).d,&(other->q_pattern).d);
    this->q_cs = other->q_cs;
    psVar1 = (other->q_sv).m_data;
    (this->q_sv).m_size = (other->q_sv).m_size;
    (this->q_sv).m_data = psVar1;
    memcpy(this->q_skiptable,other->q_skiptable,0x100);
    return;
  }
  return;
}

Assistant:

QStringMatcher::QStringMatcher(const QStringMatcher &other)
    : d_ptr(nullptr)
{
    operator=(other);
}